

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

void * yang_read_length(lys_module *module,yang_type *stype,char *value,int is_ext_instance)

{
  lys_type *plVar1;
  char *pcVar2;
  LY_ERR *pLVar3;
  
  if (is_ext_instance == 0) {
    if ((stype->base == LY_TYPE_STRING) || (stype->base == LY_TYPE_DER)) {
      stype->base = LY_TYPE_STRING;
      plVar1 = stype->type;
      if ((plVar1->info).bits.bit == (lys_type_bit *)0x0) {
        stype = (yang_type *)calloc(1,0x38);
        if ((lys_type_bit *)stype != (lys_type_bit *)0x0) {
          (plVar1->info).bits.bit = (lys_type_bit *)stype;
          goto LAB_0014df20;
        }
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_length");
      }
      else {
        ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"length","type");
      }
    }
    else {
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Unexpected length statement.");
    }
    free(value);
    stype = (yang_type *)0x0;
  }
  else {
LAB_0014df20:
    pcVar2 = lydict_insert_zc(module->ctx,value);
    ((lys_type_bit *)stype)->name = pcVar2;
  }
  return (lys_type_bit *)stype;
}

Assistant:

void *
yang_read_length(struct lys_module *module, struct yang_type *stype, char *value, int is_ext_instance)
{
    struct lys_restr *length;

    if (is_ext_instance) {
        length = (struct lys_restr *)stype;
    } else {
        if (stype->base == 0 || stype->base == LY_TYPE_STRING) {
            stype->base = LY_TYPE_STRING;
        } else {
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Unexpected length statement.");
            goto error;
        }

        if (stype->type->info.str.length) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "length", "type");
            goto error;
        }
        length = calloc(1, sizeof *length);
        if (!length) {
            LOGMEM;
            goto error;
        }
        stype->type->info.str.length = length;
    }
    length->expr = lydict_insert_zc(module->ctx, value);
    return length;

error:
    free(value);
    return NULL;
}